

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementInstancer.cpp
# Opt level: O0

void __thiscall
Rml::ElementInstancerElement::ReleaseElement(ElementInstancerElement *this,Element *element)

{
  ElementInstancerPools *this_00;
  Element *element_local;
  ElementInstancerElement *this_local;
  
  this_00 = ControlledLifetimeResource<Rml::ElementInstancerPools>::operator->
                      ((ControlledLifetimeResource<Rml::ElementInstancerPools> *)
                       element_instancer_pools);
  Pool<Rml::Element>::DestroyAndDeallocate(&this_00->pool_element,element);
  return;
}

Assistant:

void ElementInstancerElement::ReleaseElement(Element* element)
{
	element_instancer_pools->pool_element.DestroyAndDeallocate(element);
}